

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

void new_mem_loc(gen_ctx_t gen_ctx,MIR_op_t *mem_op_ref,int flag)

{
  undefined1 uVar1;
  uint uVar2;
  undefined8 uVar3;
  MIR_item_t pMVar4;
  MIR_module_t pMVar5;
  MIR_item_t_conflict pMVar6;
  mem_attr_t obj;
  mem_attr_t obj_00;
  int iVar7;
  size_t sVar8;
  MIR_item_t_conflict pMVar9;
  char *pcVar10;
  undefined1 uStack_4f;
  undefined2 uStack_4e;
  MIR_insn_t pMStack_40;
  int64_t iStack_38;
  
  sVar8 = VARR_mem_attr_tlength(gen_ctx->mem_attrs);
  uVar2 = 1;
  if (1 < (uint)sVar8) {
    uVar2 = (uint)sVar8;
  }
  (mem_op_ref->u).mem.nloc = uVar2;
  uVar1 = *(undefined1 *)&mem_op_ref->u;
  uVar3 = *(undefined8 *)((long)&(mem_op_ref->u).str.len + 4);
  uStack_4f = 0;
  pMStack_40 = (MIR_insn_t)0x0;
  iStack_38 = 0;
  if ((flag & 2U) != 0) {
    iStack_38 = 0;
    pMStack_40 = (MIR_insn_t)mem_op_ref;
    do {
      if (pMStack_40->data == (void *)0x0) {
        __assert_fail("se != ((void*)0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0xffc,"ssa_edge_t skip_move_ssa_edges(ssa_edge_t, MIR_insn_t *)");
      }
      pMStack_40 = (MIR_insn_t)**(undefined8 **)((long)pMStack_40->data + 8);
      iVar7 = move_p(pMStack_40);
      if (iVar7 == 0) {
        uVar2 = *(uint *)&pMStack_40->field_0x18;
        if ((((0x28 < (ulong)uVar2) || ((0x18c00000000U >> ((ulong)uVar2 & 0x3f) & 1) == 0)) ||
            (pMVar4 = pMStack_40[1].ops[0].u.ref, pMVar4 == (MIR_item_t)0x0)) ||
           (pMVar5 = pMVar4->module, *(char *)&pMVar5->name == '\0')) {
          uStack_4f = 1;
          break;
        }
        pMVar6 = (pMVar5->items).tail;
        pMVar9 = (MIR_item_t_conflict)-(long)pMVar6;
        if ((uVar2 & 0xfffffffe) == 0x22) {
          pMVar9 = pMVar6;
        }
        iStack_38 = (long)&pMVar9->data + iStack_38;
      }
      pMStack_40 = pMStack_40 + 1;
    } while( true );
  }
  sVar8 = VARR_mem_attr_tlength(gen_ctx->mem_attrs);
  if (sVar8 == 0) {
    obj.disp_def_p = uStack_4f;
    obj.alloca_flag = (char)flag;
    obj._2_2_ = uStack_4e;
    obj.type._0_1_ = uVar1;
    obj.type._1_3_ = 0;
    obj.alias = (int)uVar3;
    obj.nonalias = (int)((ulong)uVar3 >> 0x20);
    obj.def_insn = pMStack_40;
    obj.disp = iStack_38;
    VARR_mem_attr_tpush(gen_ctx->mem_attrs,obj);
  }
  if (((FILE *)gen_ctx->debug_file == (FILE *)0x0) || (gen_ctx->debug_level < 2)) goto LAB_0013dc4c;
  fprintf((FILE *)gen_ctx->debug_file,"    new m%lu",(ulong)(mem_op_ref->u).mem.nloc);
  if (pMStack_40 != (MIR_insn_t)0x0) {
    fprintf((FILE *)gen_ctx->debug_file,"(def_insn=%u)",
            (ulong)*(uint *)((long)pMStack_40->data + 0xc));
  }
  if ((flag & 2U) == 0) {
    if (flag != 0) goto LAB_0013dc18;
  }
  else {
    fprintf((FILE *)gen_ctx->debug_file,"(disp=%lld)",iStack_38);
LAB_0013dc18:
    pcVar10 = "may/must";
    if ((flag & 3U) == 0) {
      pcVar10 = "must";
    }
    fprintf((FILE *)gen_ctx->debug_file," is %s alloca based",pcVar10);
  }
  fputc(10,(FILE *)gen_ctx->debug_file);
LAB_0013dc4c:
  obj_00.disp_def_p = uStack_4f;
  obj_00.alloca_flag = (char)flag;
  obj_00._2_2_ = uStack_4e;
  obj_00.type._0_1_ = uVar1;
  obj_00.type._1_3_ = 0;
  obj_00.alias = (int)uVar3;
  obj_00.nonalias = (int)((ulong)uVar3 >> 0x20);
  obj_00.def_insn = pMStack_40;
  obj_00.disp = iStack_38;
  VARR_mem_attr_tpush(gen_ctx->mem_attrs,obj_00);
  return;
}

Assistant:

static void new_mem_loc (gen_ctx_t gen_ctx, MIR_op_t *mem_op_ref, int flag) {
  /* zero loc is fixed: */
  int64_t disp;
  mem_attr_t mem_attr;

  if ((mem_op_ref->u.var_mem.nloc = (uint32_t) VARR_LENGTH (mem_attr_t, mem_attrs)) == 0)
    mem_op_ref->u.var_mem.nloc = 1;
  mem_attr.alloca_flag = flag;
  mem_attr.type = mem_op_ref->u.var_mem.type;
  mem_attr.alias = mem_op_ref->u.var_mem.alias;
  mem_attr.nonalias = mem_op_ref->u.var_mem.nonalias;
  mem_attr.disp_def_p = FALSE;
  mem_attr.disp = 0;
  mem_attr.def_insn = NULL;
  if ((flag & MUST_ALLOCA) != 0) {
    mem_attr.def_insn = get_def_disp (mem_op_ref->data, &disp);
    mem_attr.disp_def_p = TRUE;
    mem_attr.disp = disp;
  }
  if (VARR_LENGTH (mem_attr_t, mem_attrs) == 0) VARR_PUSH (mem_attr_t, mem_attrs, mem_attr);
  DEBUG (2, {
    fprintf (debug_file, "    new m%lu", (unsigned long) mem_op_ref->u.var_mem.nloc);
    if (mem_attr.def_insn != NULL)
      fprintf (debug_file, "(def_insn=%u)", ((bb_insn_t) mem_attr.def_insn->data)->index);
    if (mem_attr.disp_def_p) fprintf (debug_file, "(disp=%lld)", (long long) mem_attr.disp);
    if (flag)
      fprintf (debug_file, " is %s alloca based",
               flag & (MAY_ALLOCA | MUST_ALLOCA) ? "may/must"
               : flag & MAY_ALLOCA               ? "may"
                                                 : "must");
    fprintf (debug_file, "\n");
  });
  VARR_PUSH (mem_attr_t, mem_attrs, mem_attr);
}